

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

bool baryonyx::itm::
     affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
               (solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
               longdouble delta)

{
  longdouble lhs;
  longdouble lVar1;
  bool bVar2;
  type plVar3;
  type prVar4;
  row_value *prVar5;
  longdouble lVar6;
  row_value *var_3;
  row_value *var_2;
  int i_2;
  row_value *var_1;
  int i_1;
  row_value *var;
  int i;
  longdouble d;
  longdouble old_pi;
  longdouble middle;
  longdouble two;
  longdouble one;
  longdouble delta_local;
  longdouble kappa_local;
  int r_size_local;
  int selected_local;
  int k_local;
  row_value *it_local;
  bit_array *x_local;
  solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *slv_local;
  
  plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                     (&slv->pi,(long)k);
  lhs = *plVar3;
  if (selected < 0) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&slv->R,0);
    lVar6 = (kappa / ((longdouble)1 - kappa)) * (longdouble)0.5 * prVar4->value + delta;
    for (var._4_4_ = 0; var._4_4_ != r_size; var._4_4_ = var._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var._4_4_);
      bVar2 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 + lVar6;
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 - lVar6;
      }
    }
  }
  else if (selected + 1 < r_size) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)selected);
    lVar6 = prVar4->value;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)(selected + 1));
    lVar1 = prVar4->value;
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&slv->pi,(long)k);
    *plVar3 = *plVar3 + (longdouble)0.5 * (lVar1 + lVar6);
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)(selected + 1));
    lVar6 = prVar4->value;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)selected);
    lVar6 = delta + (kappa / ((longdouble)1 - kappa)) * (lVar6 - prVar4->value);
    for (var_2._4_4_ = 0; var_2._4_4_ <= selected; var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      bVar2 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 - lVar6;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 + lVar6;
      }
    }
    for (; var_2._4_4_ != r_size; var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_2._4_4_);
      bVar2 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 + lVar6;
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 - lVar6;
      }
    }
  }
  else {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::operator[](&slv->R,(long)selected);
    lVar6 = (kappa / ((longdouble)1 - kappa)) * (longdouble)1.5 * prVar4->value + delta;
    for (var_1._4_4_ = 0; var_1._4_4_ != r_size; var_1._4_4_ = var_1._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_1._4_4_);
      prVar5 = it + prVar4->id;
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&slv->R,(long)var_1._4_4_);
      bVar2 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::rc_data::is_negative_factor(prVar4);
      if (bVar2) {
        bit_array_impl::unset(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 - lVar6;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,prVar5->column);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           (&slv->P,(long)prVar5->value);
        *plVar3 = *plVar3 + lVar6;
      }
    }
  }
  bVar2 = is_valid_constraint<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array>
                    (slv,k,x);
  if (bVar2) {
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&slv->pi,(long)k);
    bVar2 = is_signbit_change<long_double>(lhs,*plVar3);
    return bVar2;
  }
  details::fail_fast("Precondition","is_valid_constraint(slv, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"464");
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}